

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_set_standard_lookup.c
# Opt level: O2

int64_t lookup_uid(void *private_data,char *uname,int64_t uid)

{
  undefined8 *puVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  char *__ptr;
  size_t bufsize;
  size_t __buflen;
  passwd *result;
  undefined8 *local_f0;
  passwd pwent;
  char _buffer [128];
  
  if ((uname != (char *)0x0) && (*uname != '\0')) {
    uVar2 = hash(uname);
    uVar5 = (ulong)(uint)((int)((ulong)(long)(int)uVar2 % 0x7f) << 4);
    puVar1 = (undefined8 *)((long)private_data + uVar5);
    pcVar4 = *(char **)((long)private_data + uVar5);
    if ((pcVar4 != (char *)0x0) &&
       ((*(uint *)(puVar1 + 1) == uVar2 && (iVar3 = strcmp(uname,pcVar4), iVar3 == 0)))) {
      return (ulong)*(uint *)((long)puVar1 + 0xc);
    }
    free(pcVar4);
    pcVar4 = strdup(uname);
    *puVar1 = pcVar4;
    *(uint *)(puVar1 + 1) = uVar2;
    pcVar4 = _buffer;
    __buflen = 0x80;
    __ptr = (char *)0x0;
    local_f0 = puVar1;
    do {
      result = &pwent;
      iVar3 = getpwnam_r(uname,(passwd *)&pwent,pcVar4,__buflen,(passwd **)&result);
      if (iVar3 != 0x22) goto LAB_00146ca8;
      __buflen = __buflen * 2;
      free(__ptr);
      pcVar4 = (char *)malloc(__buflen);
      __ptr = pcVar4;
    } while (pcVar4 != (char *)0x0);
    __ptr = (char *)0x0;
LAB_00146ca8:
    if (result != (passwd *)0x0) {
      uid = (int64_t)result->pw_uid;
    }
    free(__ptr);
    *(int *)((long)local_f0 + 0xc) = (int)uid;
  }
  return uid;
}

Assistant:

static int64_t
lookup_uid(void *private_data, const char *uname, int64_t uid)
{
	int h;
	struct bucket *b;
	struct bucket *ucache = (struct bucket *)private_data;

	/* If no uname, just use the uid provided. */
	if (uname == NULL || *uname == '\0')
		return (uid);

	/* Try to find uname in the cache. */
	h = hash(uname);
	b = &ucache[h % cache_size ];
	if (b->name != NULL && b->hash == h && strcmp(uname, b->name) == 0)
		return ((uid_t)b->id);

	/* Free the cache slot for a new entry. */
	free(b->name);
	b->name = strdup(uname);
	/* Note: If strdup fails, that's okay; we just won't cache. */
	b->hash = h;
#if HAVE_PWD_H
#  if HAVE_GETPWNAM_R
	{
		char _buffer[128];
		size_t bufsize = 128;
		char *buffer = _buffer;
		char *allocated = NULL;
		struct passwd	pwent, *result;
		int r;

		for (;;) {
			result = &pwent; /* Old getpwnam_r ignores last arg. */
			r = getpwnam_r(uname, &pwent, buffer, bufsize, &result);
			if (r == 0)
				break;
			if (r != ERANGE)
				break;
			bufsize *= 2;
			free(allocated);
			allocated = malloc(bufsize);
			if (allocated == NULL)
				break;
			buffer = allocated;
		}
		if (result != NULL)
			uid = result->pw_uid;
		free(allocated);
	}
#  else /* HAVE_GETPWNAM_R */
	{
		struct passwd *result;

		result = getpwnam(uname);
		if (result != NULL)
			uid = result->pw_uid;
	}
#endif	/* HAVE_GETPWNAM_R */
#elif defined(_WIN32) && !defined(__CYGWIN__)
	/* TODO: do a uname->uid lookup for Windows. */
#else
	#error No way to look up uids on this platform
#endif
	b->id = (uid_t)uid;

	return (uid);
}